

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::ReservedNamesTest::isStructAllowed
          (ReservedNamesTest *this,_shader_type shader_type,_language_feature language_feature)

{
  bool local_21;
  bool structAllowed;
  _language_feature language_feature_local;
  _shader_type shader_type_local;
  ReservedNamesTest *this_local;
  
  local_21 = false;
  if ((language_feature == LANGUAGE_FEATURE_UNIFORM) ||
     (language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME)) {
    this_local._7_1_ = true;
  }
  else {
    switch(shader_type) {
    case LANGUAGE_FEATURE_ATOMIC_COUNTER:
      break;
    case LANGUAGE_FEATURE_ATTRIBUTE:
      local_21 = language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME;
      break;
    case LANGUAGE_FEATURE_CONSTANT:
    case LANGUAGE_FEATURE_FUNCTION_ARGUMENT_NAME:
    case LANGUAGE_FEATURE_FUNCTION_NAME:
      if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME) {
        local_21 = true;
      }
      else {
        local_21 = language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME;
      }
      break;
    case LANGUAGE_FEATURE_INPUT:
      local_21 = language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME;
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool ReservedNamesTest::isStructAllowed(_shader_type shader_type, _language_feature language_feature) const
{
	bool structAllowed = false;

	if (language_feature == LANGUAGE_FEATURE_UNIFORM || language_feature == LANGUAGE_FEATURE_UNIFORM_BLOCK_NAME)
	{
		return true;
	}

	switch (shader_type)
	{
	case SHADER_TYPE_FRAGMENT:
	{
		if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME)
		{
			structAllowed = true;
		}
	}
	break;
	case SHADER_TYPE_GEOMETRY:
	case SHADER_TYPE_TESS_CONTROL:
	case SHADER_TYPE_TESS_EVALUATION:
	{
		if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME)
		{
			structAllowed = true;
		}
		else if (language_feature == LANGUAGE_FEATURE_INPUT_BLOCK_NAME)
		{
			structAllowed = true;
		}
	}
	break;
	case SHADER_TYPE_VERTEX:
	{
		if (language_feature == LANGUAGE_FEATURE_OUTPUT_BLOCK_NAME)
		{
			structAllowed = true;
		}
	}
	break;
	case SHADER_TYPE_COMPUTE:
	default:
		break;
	}

	return structAllowed;
}